

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void loop_through_half_edges_inside_a_face(Mesh *new_mesh)

{
  value_type pFVar1;
  Mesh *pMVar2;
  uint uVar3;
  uint i_00;
  uint i_01;
  uint uVar4;
  ulong uVar5;
  size_type sVar6;
  reference ppFVar7;
  ostream *poVar8;
  HalfEdge *pHVar9;
  uint he_4;
  uint he_3;
  uint he_2;
  uint he_1;
  vector<HalfMesh::Face_*,_std::allocator<HalfMesh::Face_*>_> local_50;
  Face *local_38;
  Face *new_face;
  uint local_14;
  Mesh *pMStack_10;
  uint i;
  Mesh *new_mesh_local;
  
  local_14 = 0;
  pMStack_10 = new_mesh;
  while( true ) {
    uVar5 = (ulong)local_14;
    HalfMesh::Mesh::get_faces
              ((vector<HalfMesh::Face_*,_std::allocator<HalfMesh::Face_*>_> *)&new_face,pMStack_10);
    sVar6 = std::vector<HalfMesh::Face_*,_std::allocator<HalfMesh::Face_*>_>::size
                      ((vector<HalfMesh::Face_*,_std::allocator<HalfMesh::Face_*>_> *)&new_face);
    std::vector<HalfMesh::Face_*,_std::allocator<HalfMesh::Face_*>_>::~vector
              ((vector<HalfMesh::Face_*,_std::allocator<HalfMesh::Face_*>_> *)&new_face);
    if (sVar6 <= uVar5) break;
    HalfMesh::Mesh::get_faces(&local_50,pMStack_10);
    ppFVar7 = std::vector<HalfMesh::Face_*,_std::allocator<HalfMesh::Face_*>_>::at
                        (&local_50,(ulong)local_14);
    pFVar1 = *ppFVar7;
    std::vector<HalfMesh::Face_*,_std::allocator<HalfMesh::Face_*>_>::~vector(&local_50);
    local_38 = pFVar1;
    poVar8 = std::operator<<((ostream *)&std::cout,"One half edge for face F: ");
    uVar3 = HalfMesh::Face::handle(local_38);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar3);
    poVar8 = std::operator<<(poVar8," HE : ");
    pHVar9 = HalfMesh::Face::get_one_half_edge(local_38);
    uVar3 = HalfMesh::HalfEdge::handle(pHVar9);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar3);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    pHVar9 = HalfMesh::Face::get_one_half_edge(local_38);
    uVar3 = HalfMesh::HalfEdge::handle(pHVar9);
    pMVar2 = pMStack_10;
    pHVar9 = HalfMesh::Mesh::get_half_edge(pMStack_10,uVar3);
    pHVar9 = HalfMesh::Mesh::get_next_half_edge(pMVar2,pHVar9,local_38);
    i_00 = HalfMesh::HalfEdge::handle(pHVar9);
    pMVar2 = pMStack_10;
    pHVar9 = HalfMesh::Mesh::get_half_edge(pMStack_10,i_00);
    pHVar9 = HalfMesh::Mesh::get_next_half_edge(pMVar2,pHVar9,local_38);
    i_01 = HalfMesh::HalfEdge::handle(pHVar9);
    pMVar2 = pMStack_10;
    pHVar9 = HalfMesh::Mesh::get_half_edge(pMStack_10,i_01);
    pHVar9 = HalfMesh::Mesh::get_next_half_edge(pMVar2,pHVar9,local_38);
    uVar4 = HalfMesh::HalfEdge::handle(pHVar9);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar3);
    poVar8 = std::operator<<(poVar8,"->");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,i_00);
    poVar8 = std::operator<<(poVar8,"->");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,i_01);
    poVar8 = std::operator<<(poVar8,"->");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar4);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void loop_through_half_edges_inside_a_face(HalfMesh::Mesh *new_mesh) {
    for (unsigned int i = 0; i < new_mesh->get_faces().size(); ++i) {
        HalfMesh::Face *new_face = new_mesh->get_faces().at(i);
        std::cout << "One half edge for face F: " << new_face->handle() << " HE : "
                  << new_face->get_one_half_edge()->handle() << std::endl;
        unsigned int he_1, he_2, he_3, he_4;
        he_1 = new_face->get_one_half_edge()->handle();
        he_2 = new_mesh->get_next_half_edge(new_mesh->get_half_edge(he_1), new_face)->handle();
        he_3 = new_mesh->get_next_half_edge(new_mesh->get_half_edge(he_2), new_face)->handle();
        he_4 = new_mesh->get_next_half_edge(new_mesh->get_half_edge(he_3), new_face)->handle();
        std::cout << he_1 << "->" << he_2 << "->" << he_3 << "->" << he_4 << std::endl;
    }
}